

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void freeP4(sqlite3 *db,int p4type,void *p4)

{
  Mem *p;
  
  if (p4 == (void *)0x0) {
    return;
  }
  switch(p4type) {
  case -0xf:
  case -0xd:
  case -0xc:
  case -1:
    goto switchD_001282c4_caseD_fffffff1;
  case -0xb:
    if (db->pnBytesFreed == (int *)0x0) {
LAB_00128310:
      sqlite3_free(p4);
      return;
    }
    break;
  case -10:
    if (db->pnBytesFreed == (int *)0x0) {
      sqlite3VtabUnlock((VTable *)p4);
      return;
    }
    break;
  case -8:
    if (db->pnBytesFreed == (int *)0x0) {
      sqlite3ValueFree((sqlite3_value *)p4);
      return;
    }
    if (*(int *)((long)p4 + 0x20) != 0) {
      sqlite3DbFree(db,*(void **)((long)p4 + 0x18));
    }
    goto switchD_001282c4_caseD_fffffff1;
  case -6:
    if ((db->pnBytesFreed == (int *)0x0) && (*(int *)p4 = *p4 + -1, *p4 == 0)) goto LAB_00128310;
    break;
  case -5:
    if ((*(byte *)((long)p4 + 2) & 0x10) == 0) {
      return;
    }
switchD_001282c4_caseD_fffffff1:
    sqlite3DbFree(db,p4);
    return;
  }
  return;
}

Assistant:

static void freeP4(sqlite3 *db, int p4type, void *p4){
  if( p4 ){
    assert( db );
    switch( p4type ){
      case P4_REAL:
      case P4_INT64:
      case P4_DYNAMIC:
      case P4_INTARRAY: {
        sqlite3DbFree(db, p4);
        break;
      }
      case P4_KEYINFO: {
        if( db->pnBytesFreed==0 ) sqlite3KeyInfoUnref((KeyInfo*)p4);
        break;
      }
      case P4_MPRINTF: {
        if( db->pnBytesFreed==0 ) sqlite3_free(p4);
        break;
      }
      case P4_FUNCDEF: {
        freeEphemeralFunction(db, (FuncDef*)p4);
        break;
      }
      case P4_MEM: {
        if( db->pnBytesFreed==0 ){
          sqlite3ValueFree((sqlite3_value*)p4);
        }else{
          Mem *p = (Mem*)p4;
          if( p->szMalloc ) sqlite3DbFree(db, p->zMalloc);
          sqlite3DbFree(db, p);
        }
        break;
      }
      case P4_VTAB : {
        if( db->pnBytesFreed==0 ) sqlite3VtabUnlock((VTable *)p4);
        break;
      }
    }
  }
}